

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int * Abc_NtkSimulateOneNode(Abc_Ntk_t *pNtk,int *pModel,int input,Vec_Ptr_t **topOrder)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar1;
  long *Entry;
  int *piVar2;
  void *pvVar3;
  uint uVar4;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar5;
  int i;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  p = Vec_PtrAlloc(0x32);
  Abc_NtkIncrementTravId(pNtk);
  pAVar1 = Abc_AigConst1(pNtk);
  pAVar1->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  pAVar1 = Abc_NtkCi(pNtk,input);
  (pAVar1->field_6).iTemp = pModel[input];
  iVar6 = topOrder[input]->nSize;
  while (0 < iVar6) {
    iVar6 = iVar6 + -1;
    Entry = (long *)Vec_PtrEntry(topOrder[input],iVar6);
    lVar7 = *(long *)(*(long *)(*Entry + 0x20) + 8);
    uVar4 = (*(uint *)((long)Entry + 0x14) >> 0xb & 1 ^
            *(uint *)(*(long *)(lVar7 + (long)((int *)Entry[4])[1] * 8) + 0x40)) &
            (*(uint *)((long)Entry + 0x14) >> 10 & 1 ^
            *(uint *)(*(long *)(lVar7 + (long)*(int *)Entry[4] * 8) + 0x40));
    if (*(uint *)(Entry + 8) != uVar4) {
      *(uint *)(Entry + 8) = uVar4;
      Vec_PtrPush(p,Entry);
    }
  }
  uVar8 = (ulong)pNtk->vCos->nSize;
  piVar2 = (int *)malloc(uVar8 << 2);
  for (lVar7 = 0; lVar7 < (int)uVar8; lVar7 = lVar7 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,(int)lVar7);
    piVar2[lVar7] =
         *(uint *)&pAVar1->field_0x14 >> 10 & 1 ^
         *(uint *)((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x40);
    uVar8 = (ulong)(uint)pNtk->vCos->nSize;
  }
  pAVar1 = Abc_NtkCi(pNtk,input);
  aVar5._1_7_ = 0;
  aVar5.iTemp._0_1_ = (pAVar1->field_6).pTemp != (void *)0x1;
  pAVar1->field_6 = aVar5;
  i = 0;
  iVar6 = p->nSize;
  if (p->nSize < 1) {
    iVar6 = i;
  }
  for (; iVar6 != i; i = i + 1) {
    pvVar3 = Vec_PtrEntry(p,i);
    *(ulong *)((long)pvVar3 + 0x40) = (ulong)(*(long *)((long)pvVar3 + 0x40) != 1);
  }
  Vec_PtrFree(p);
  return piVar2;
}

Assistant:

int * Abc_NtkSimulateOneNode( Abc_Ntk_t * pNtk, int * pModel, int input, Vec_Ptr_t ** topOrder )
{
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int * pValues, Value0, Value1, i;
   
    vNodes = Vec_PtrAlloc( 50 );
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values     
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    pNode = Abc_NtkCi(pNtk, input);
    pNode->iTemp = pModel[input];
    
    // simulate in the topological order    
    for(i = Vec_PtrSize(topOrder[input])-1; i >= 0; i--)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(topOrder[input], i);        
        
        Value0 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ Abc_ObjFaninC1(pNode);
        
        if( pNode->iTemp != (Value0 & Value1))
        {
            pNode->iTemp = (Value0 & Value1);
            Vec_PtrPush(vNodes, pNode);
        }
    
    }    
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
    
    pNode = Abc_NtkCi(pNtk, input);
    if(pNode->pCopy == (Abc_Obj_t *)1)
        pNode->pCopy = (Abc_Obj_t *)0;
    else
        pNode->pCopy = (Abc_Obj_t *)1;

    for(i = 0; i < Vec_PtrSize(vNodes); i++)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i);

        if(pNode->pCopy == (Abc_Obj_t *)1)
            pNode->pCopy = (Abc_Obj_t *)0;
        else
            pNode->pCopy = (Abc_Obj_t *)1;
    }

    Vec_PtrFree( vNodes );

    return pValues;
}